

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.cpp
# Opt level: O0

ostream * __thiscall L14_2::Student::output(Student *this,ostream *os)

{
  size_t sVar1;
  double *pdVar2;
  ostream *poVar3;
  int local_1c;
  int size;
  int i;
  ostream *os_local;
  Student *this_local;
  
  sVar1 = std::valarray<double>::size(&this->super_valarray<double>);
  if ((int)sVar1 < 1) {
    std::operator<<(os,"empty array ");
  }
  else {
    for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
      pdVar2 = std::valarray<double>::operator[](&this->super_valarray<double>,(long)local_1c);
      poVar3 = (ostream *)std::ostream::operator<<(os,*pdVar2);
      std::operator<<(poVar3," ");
      if (local_1c % 5 == 4) {
        std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      }
    }
    if (local_1c % 5 != 0) {
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    }
  }
  return os;
}

Assistant:

std::ostream& Student::output(std::ostream &os) const {
        int i;
        int size = NumberArray::size();
        if (size > 0) {
            for (i = 0; i < size; i++) {
                os << NumberArray::operator[](i) << " ";
                if (i % 5 == 4) {
                    os << std::endl;
                }
            }
            if (i % 5 != 0) {
                os << std::endl;
            }
        } else {
            os << "empty array ";
        }
        return os;
    }